

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

UGroup * re2::LookupGroup(StringPiece *name,UGroup *groups,int ngroups)

{
  bool bVar1;
  int in_EDX;
  long in_RSI;
  StringPiece *in_RDI;
  int i;
  char *in_stack_ffffffffffffffd8;
  int iVar2;
  StringPiece *in_stack_fffffffffffffff8;
  
  iVar2 = 0;
  while( true ) {
    if (in_EDX <= iVar2) {
      return (UGroup *)0x0;
    }
    StringPiece::StringPiece((StringPiece *)CONCAT44(in_EDX,iVar2),in_stack_ffffffffffffffd8);
    bVar1 = operator==(in_stack_fffffffffffffff8,in_RDI);
    if (bVar1) break;
    iVar2 = iVar2 + 1;
  }
  return (UGroup *)(in_RSI + (long)iVar2 * 0x30);
}

Assistant:

static const UGroup* LookupGroup(const StringPiece& name,
                                 const UGroup *groups, int ngroups) {
  // Simple name lookup.
  for (int i = 0; i < ngroups; i++)
    if (StringPiece(groups[i].name) == name)
      return &groups[i];
  return NULL;
}